

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall
QDomElementPrivate::save(QDomElementPrivate *this,QTextStream *s,int depth,int indent)

{
  QDomNamedNodeMapPrivate *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined1 auVar5 [8];
  undefined1 auVar6 [8];
  qsizetype qVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  QTextStream *pQVar12;
  QDomNodePrivate **ppQVar13;
  QDomNodePrivate *pQVar14;
  qsizetype in_R8;
  long lVar15;
  long lVar16;
  SavedAttribute *__i;
  SavedAttribute *pSVar17;
  QString *pQVar18;
  QDuplicateTracker<QString,_32UL> *this_00;
  long in_FS_OFFSET;
  pair<const_QString_&,_QDomNodePrivate_*const_&> pVar19;
  QArrayDataPointer<char16_t> local_a60;
  QArrayDataPointer<char16_t> local_a48;
  SavedAttribute local_a28;
  undefined1 local_9d8 [8];
  char16_t *pcStack_9d0;
  qsizetype local_9c8;
  QString QStack_9c0;
  Data *local_9a8;
  char16_t *pcStack_9a0;
  qsizetype local_998;
  const_iterator local_988;
  QArrayDataPointer<char16_t> local_968;
  QArrayDataPointer<char16_t> local_948;
  QDuplicateTracker<QString,_32UL> outputtedPrefixes;
  undefined1 local_298 [608];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar14 = (this->super_QDomNodePrivate).prev;
  if ((pQVar14 == (QDomNodePrivate *)0x0) ||
     (iVar11 = (*pQVar14->_vptr_QDomNodePrivate[0xb])(), 1 < iVar11 - 3U)) {
    iVar11 = 0;
    if (0 < indent) {
      iVar11 = depth * indent;
    }
    QString::QString((QString *)&outputtedPrefixes,(long)iVar11,(QChar)0x20);
    QTextStream::operator<<(s,(QString *)&outputtedPrefixes);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&outputtedPrefixes);
  }
  local_948.d = (this->super_QDomNodePrivate).name.d.d;
  local_948.ptr = (this->super_QDomNodePrivate).name.d.ptr;
  local_948.size = (this->super_QDomNodePrivate).name.d.size;
  if (local_948.d != (Data *)0x0) {
    LOCK();
    ((local_948.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_948.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_968.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_968.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_968.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____s((QString *)&local_968,L"",0);
  if ((this->super_QDomNodePrivate).namespaceURI.d.ptr != (char16_t *)0x0) {
    if ((this->super_QDomNodePrivate).prefix.d.size == 0) {
      this_00 = &outputtedPrefixes;
      Qt::Literals::StringLiterals::operator____s((QString *)this_00,L" xmlns",6);
      qVar4 = local_968.size;
      pcVar3 = local_968.ptr;
      pDVar2 = local_968.d;
      local_968.d = (Data *)outputtedPrefixes.buffer._0_8_;
      local_968.ptr = (char16_t *)outputtedPrefixes.buffer._8_8_;
      outputtedPrefixes.buffer._0_8_ = pDVar2;
      outputtedPrefixes.buffer._8_8_ = pcVar3;
      local_968.size._0_1_ = outputtedPrefixes.buffer[0x10];
      local_968.size._1_1_ = outputtedPrefixes.buffer[0x11];
      local_968.size._2_1_ = outputtedPrefixes.buffer[0x12];
      local_968.size._3_1_ = outputtedPrefixes.buffer[0x13];
      local_968.size._4_1_ = outputtedPrefixes.buffer[0x14];
      local_968.size._5_1_ = outputtedPrefixes.buffer[0x15];
      local_968.size._6_1_ = outputtedPrefixes.buffer[0x16];
      local_968.size._7_1_ = outputtedPrefixes.buffer[0x17];
      qVar7 = local_968.size;
      local_968.size._0_1_ = (undefined1)qVar4;
      local_968.size._1_1_ = SUB81(qVar4,1);
      local_968.size._2_1_ = SUB81(qVar4,2);
      local_968.size._3_1_ = SUB81(qVar4,3);
      local_968.size._4_1_ = SUB81(qVar4,4);
      local_968.size._5_1_ = SUB81(qVar4,5);
      local_968.size._6_1_ = SUB81(qVar4,6);
      local_968.size._7_1_ = SUB81(qVar4,7);
      outputtedPrefixes.buffer[0x10] = (undefined1)local_968.size;
      outputtedPrefixes.buffer[0x11] = local_968.size._1_1_;
      outputtedPrefixes.buffer[0x12] = local_968.size._2_1_;
      outputtedPrefixes.buffer[0x13] = local_968.size._3_1_;
      outputtedPrefixes.buffer[0x14] = local_968.size._4_1_;
      outputtedPrefixes.buffer[0x15] = local_968.size._5_1_;
      outputtedPrefixes.buffer[0x16] = local_968.size._6_1_;
      outputtedPrefixes.buffer[0x17] = local_968.size._7_1_;
      local_968.size = qVar7;
    }
    else {
      local_298._16_8_ = &(this->super_QDomNodePrivate).name;
      pQVar18 = &(this->super_QDomNodePrivate).prefix;
      local_298._8_2_ = 0x3a;
      local_298._0_8_ = pQVar18;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                ((QString *)&outputtedPrefixes,
                 (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
                 local_298);
      qVar4 = local_948.size;
      pcVar3 = local_948.ptr;
      pDVar2 = local_948.d;
      local_948.d = (Data *)outputtedPrefixes.buffer._0_8_;
      local_948.ptr = (char16_t *)outputtedPrefixes.buffer._8_8_;
      outputtedPrefixes.buffer._0_8_ = pDVar2;
      outputtedPrefixes.buffer._8_8_ = pcVar3;
      local_948.size._0_1_ = outputtedPrefixes.buffer[0x10];
      local_948.size._1_1_ = outputtedPrefixes.buffer[0x11];
      local_948.size._2_1_ = outputtedPrefixes.buffer[0x12];
      local_948.size._3_1_ = outputtedPrefixes.buffer[0x13];
      local_948.size._4_1_ = outputtedPrefixes.buffer[0x14];
      local_948.size._5_1_ = outputtedPrefixes.buffer[0x15];
      local_948.size._6_1_ = outputtedPrefixes.buffer[0x16];
      local_948.size._7_1_ = outputtedPrefixes.buffer[0x17];
      qVar7 = local_948.size;
      local_948.size._0_1_ = (undefined1)qVar4;
      local_948.size._1_1_ = SUB81(qVar4,1);
      local_948.size._2_1_ = SUB81(qVar4,2);
      local_948.size._3_1_ = SUB81(qVar4,3);
      local_948.size._4_1_ = SUB81(qVar4,4);
      local_948.size._5_1_ = SUB81(qVar4,5);
      local_948.size._6_1_ = SUB81(qVar4,6);
      local_948.size._7_1_ = SUB81(qVar4,7);
      outputtedPrefixes.buffer[0x10] = (undefined1)local_948.size;
      outputtedPrefixes.buffer[0x11] = local_948.size._1_1_;
      outputtedPrefixes.buffer[0x12] = local_948.size._2_1_;
      outputtedPrefixes.buffer[0x13] = local_948.size._3_1_;
      outputtedPrefixes.buffer[0x14] = local_948.size._4_1_;
      outputtedPrefixes.buffer[0x15] = local_948.size._5_1_;
      outputtedPrefixes.buffer[0x16] = local_948.size._6_1_;
      outputtedPrefixes.buffer[0x17] = local_948.size._7_1_;
      local_948.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&outputtedPrefixes);
      this_00 = (QDuplicateTracker<QString,_32UL> *)local_9d8;
      Qt::Literals::StringLiterals::operator____s((QString *)this_00,L" xmlns:",7);
      qVar4 = local_9c8;
      outputtedPrefixes.buffer._8_8_ = pcStack_9d0;
      auVar5 = local_9d8;
      local_9d8 = (undefined1  [8])0x0;
      auVar6 = local_9d8;
      pcStack_9d0 = (char16_t *)0x0;
      local_9c8 = 0;
      qVar7 = local_9c8;
      local_9d8[0] = auVar5[0];
      local_9d8[1] = auVar5[1];
      local_9d8[2] = auVar5[2];
      local_9d8[3] = auVar5[3];
      local_9d8[4] = auVar5[4];
      local_9d8[5] = auVar5[5];
      local_9d8[6] = auVar5[6];
      local_9d8[7] = auVar5[7];
      outputtedPrefixes.buffer[0] = local_9d8[0];
      outputtedPrefixes.buffer[1] = local_9d8[1];
      outputtedPrefixes.buffer[2] = local_9d8[2];
      outputtedPrefixes.buffer[3] = local_9d8[3];
      outputtedPrefixes.buffer[4] = local_9d8[4];
      outputtedPrefixes.buffer[5] = local_9d8[5];
      outputtedPrefixes.buffer[6] = local_9d8[6];
      outputtedPrefixes.buffer[7] = local_9d8[7];
      local_9c8._0_1_ = (undefined1)qVar4;
      local_9c8._1_1_ = SUB81(qVar4,1);
      local_9c8._2_1_ = SUB81(qVar4,2);
      local_9c8._3_1_ = SUB81(qVar4,3);
      local_9c8._4_1_ = SUB81(qVar4,4);
      local_9c8._5_1_ = SUB81(qVar4,5);
      local_9c8._6_1_ = SUB81(qVar4,6);
      local_9c8._7_1_ = SUB81(qVar4,7);
      outputtedPrefixes.buffer[0x10] = (undefined1)local_9c8;
      outputtedPrefixes.buffer[0x11] = local_9c8._1_1_;
      outputtedPrefixes.buffer[0x12] = local_9c8._2_1_;
      outputtedPrefixes.buffer[0x13] = local_9c8._3_1_;
      outputtedPrefixes.buffer[0x14] = local_9c8._4_1_;
      outputtedPrefixes.buffer[0x15] = local_9c8._5_1_;
      outputtedPrefixes.buffer[0x16] = local_9c8._6_1_;
      outputtedPrefixes.buffer[0x17] = local_9c8._7_1_;
      local_9d8 = auVar6;
      local_9c8 = qVar7;
      outputtedPrefixes.buffer._24_8_ = pQVar18;
      QStringBuilder<QString,_const_QString_&>::convertTo<QString>
                ((QString *)local_298,(QStringBuilder<QString,_const_QString_&> *)&outputtedPrefixes
                );
      qVar4 = local_968.size;
      pcVar3 = local_968.ptr;
      pDVar2 = local_968.d;
      local_968.d = (Data *)local_298._0_8_;
      local_968.ptr = (char16_t *)local_298._8_8_;
      local_298._0_8_ = pDVar2;
      local_298._8_8_ = pcVar3;
      local_968.size = local_298._16_8_;
      local_298._16_8_ = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_298);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&outputtedPrefixes);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
    Qt::Literals::StringLiterals::operator____s((QString *)local_9d8,L"=\"",2);
    in_R8 = 0;
    encodeText(&local_a28.prefix,&(this->super_QDomNodePrivate).namespaceURI,true,false,false);
    QStringBuilder<QString,_QString>::QStringBuilder
              ((QStringBuilder<QString,_QString> *)local_298,(QString *)local_9d8,&local_a28.prefix)
    ;
    QStringBuilder<QString,_QString>::QStringBuilder
              ((QStringBuilder<QString,_QString> *)&outputtedPrefixes,
               (QStringBuilder<QString,_QString> *)local_298);
    outputtedPrefixes.buffer[0x30] = '\"';
    outputtedPrefixes.buffer[0x31] = '\0';
    operator+=((QString *)&local_968,
               (QStringBuilder<QStringBuilder<QString,_QString>,_char16_t> *)&outputtedPrefixes);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)&outputtedPrefixes);
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)local_298)
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_9d8);
  }
  pQVar12 = (QTextStream *)QTextStream::operator<<(s,'<');
  pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12,(QString *)&local_948);
  QTextStream::operator<<(pQVar12,(QString *)&local_968);
  pQVar1 = this->m_attr;
  if ((pQVar1->map).m_size != 0) {
    pSVar17 = (SavedAttribute *)(local_298 + 0x18);
    memset(pSVar17,0xaa,0x240);
    local_298._0_8_ = (QString *)0x8;
    local_298._8_8_ = (char16_t *)0x0;
    lVar16 = (pQVar1->map).m_size;
    local_298._16_8_ = pSVar17;
    if (8 < lVar16) {
      QVLABase<SavedAttribute>::reallocate_impl
                ((QVLABase<SavedAttribute> *)local_298,(qsizetype)pSVar17,(void *)0x0,lVar16,in_R8);
    }
    memcpy(&outputtedPrefixes,&DAT_0011c050,0x688);
    QDuplicateTracker<QString,_32UL>::QDuplicateTracker(&outputtedPrefixes);
    local_988.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_988.i.d =
         (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_988.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QMultiHash<QString,_QDomNodePrivate_*>::begin(&local_988,&this->m_attr->map);
    while (uVar9 = local_298._16_8_, uVar8 = local_298._8_8_, local_988.e != (Chain **)0x0) {
      pVar19 = QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
               ::operator*((QKeyValueIterator<const_QString_&,_QDomNodePrivate_*const_&,_QMultiHash<QString,_QDomNodePrivate_*>::const_iterator>
                            *)&local_988);
      ppQVar13 = pVar19.second;
      local_9a8 = (Data *)0x0;
      pcStack_9a0 = (char16_t *)0x0;
      QStack_9c0.d.ptr = (char16_t *)0x0;
      QStack_9c0.d.size = 0;
      local_998 = 0;
      local_9c8 = 0;
      QStack_9c0.d.d = (Data *)0x0;
      local_9d8 = (undefined1  [8])0x0;
      pcStack_9d0 = (char16_t *)0x0;
      QString::operator=(&QStack_9c0,&(*ppQVar13)->name);
      encodeText(&local_a28.prefix,&(*ppQVar13)->value,true,true,false);
      qVar4 = local_998;
      pcVar3 = pcStack_9a0;
      pDVar2 = local_9a8;
      local_9a8 = local_a28.prefix.d.d;
      pcStack_9a0 = local_a28.prefix.d.ptr;
      local_a28.prefix.d.d = pDVar2;
      local_a28.prefix.d.ptr = pcVar3;
      local_998 = local_a28.prefix.d.size;
      local_a28.prefix.d.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a28);
      if (((*ppQVar13)->namespaceURI).d.ptr == (char16_t *)0x0) {
        QVarLengthArray<SavedAttribute,_8LL>::push_back
                  ((QVarLengthArray<SavedAttribute,_8LL> *)local_298,(SavedAttribute *)local_9d8);
      }
      else {
        QString::operator=((QString *)local_9d8,&(*ppQVar13)->prefix);
        QVarLengthArray<SavedAttribute,_8LL>::push_back
                  ((QVarLengthArray<SavedAttribute,_8LL> *)local_298,(SavedAttribute *)local_9d8);
        pQVar14 = *ppQVar13;
        if (pQVar14->ownerNode != (QDomNodePrivate *)0x0) {
          bVar10 = operator!=(&pQVar14->ownerNode->prefix,&pQVar14->prefix);
          if (!bVar10) goto LAB_001120bb;
          pQVar14 = *ppQVar13;
        }
        bVar10 = QDuplicateTracker<QString,_32UL>::hasSeen(&outputtedPrefixes,&pQVar14->prefix);
        if (!bVar10) {
          local_a28.encodedValue.d.ptr = (char16_t *)0x0;
          local_a28.encodedValue.d.size = 0;
          local_a28.name.d.size = 0;
          local_a28.encodedValue.d.d = (Data *)0x0;
          local_a60.d = (Data *)0x0;
          local_a60.ptr = (char16_t *)0x0;
          local_a60.size = 0;
          local_a28.name.d.d = (Data *)0x0;
          local_a28.name.d.ptr = (char16_t *)0x0;
          local_a28.prefix.d.d = (Data *)0x0;
          local_a48.d = (Data *)0x0;
          local_a28.prefix.d.ptr = L"xmlns";
          local_a48.ptr = (char16_t *)0x0;
          local_a48.size = 0;
          local_a28.prefix.d.size = 5;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a48);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a60);
          QString::operator=(&local_a28.name,&(*ppQVar13)->prefix);
          encodeText((QString *)&local_a48,&(*ppQVar13)->namespaceURI,true,true,false);
          qVar4 = local_a28.encodedValue.d.size;
          pcVar3 = local_a28.encodedValue.d.ptr;
          pDVar2 = local_a28.encodedValue.d.d;
          local_a28.encodedValue.d.d = local_a48.d;
          local_a28.encodedValue.d.ptr = local_a48.ptr;
          local_a48.d = pDVar2;
          local_a48.ptr = pcVar3;
          local_a28.encodedValue.d.size = local_a48.size;
          local_a48.size = qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a48);
          QVarLengthArray<SavedAttribute,_8LL>::push_back
                    ((QVarLengthArray<SavedAttribute,_8LL> *)local_298,&local_a28);
          save::SavedAttribute::~SavedAttribute(&local_a28);
        }
      }
LAB_001120bb:
      save::SavedAttribute::~SavedAttribute((SavedAttribute *)local_9d8);
      QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++(&local_988);
    }
    if ((char16_t *)local_298._8_8_ != (char16_t *)0x0) {
      lVar15 = local_298._8_8_ * 0x48;
      pSVar17 = (SavedAttribute *)(local_298._16_8_ + local_298._8_8_ * 0x48);
      lVar16 = 0x3f;
      if ((char16_t *)local_298._8_8_ != (char16_t *)0x0) {
        for (; (ulong)local_298._8_8_ >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,long,__gnu_cxx::__ops::_Iter_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                (local_298._16_8_,pSVar17,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)uVar8 < 0x11) {
        std::
        __insertion_sort<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,__gnu_cxx::__ops::_Iter_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                  (uVar9,pSVar17);
      }
      else {
        pSVar17 = (SavedAttribute *)(uVar9 + 0x480);
        std::
        __insertion_sort<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,__gnu_cxx::__ops::_Iter_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                  (uVar9,pSVar17);
        for (lVar15 = lVar15 + -0x480; lVar15 != 0; lVar15 = lVar15 + -0x48) {
          std::
          __unguarded_linear_insert<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,__gnu_cxx::__ops::_Val_comp_iter<QDomElementPrivate::save(QTextStream&,int,int)const::__0>>
                    (pSVar17);
          pSVar17 = pSVar17 + 1;
        }
      }
    }
    pQVar18 = (QString *)(local_298._16_8_ + 0x18);
    for (lVar16 = local_298._8_8_ * 0x48; lVar16 != 0; lVar16 = lVar16 + -0x48) {
      QTextStream::operator<<(s,' ');
      if ((((SavedAttribute *)(pQVar18 + -1))->prefix).d.size != 0) {
        pQVar12 = (QTextStream *)QTextStream::operator<<(s,(QString *)(pQVar18 + -1));
        QTextStream::operator<<(pQVar12,':');
      }
      pQVar12 = (QTextStream *)QTextStream::operator<<(s,pQVar18);
      pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12,"=\"");
      pQVar12 = (QTextStream *)QTextStream::operator<<(pQVar12,pQVar18 + 1);
      QTextStream::operator<<(pQVar12,'\"');
      pQVar18 = pQVar18 + 3;
    }
    QDuplicateTracker<QString,_32UL>::~QDuplicateTracker(&outputtedPrefixes);
    std::destroy_n<QDomElementPrivate::save(QTextStream&,int,int)const::SavedAttribute*,long_long>
              ((SavedAttribute *)local_298._16_8_,local_298._8_8_);
    if ((SavedAttribute *)local_298._16_8_ != (SavedAttribute *)(local_298 + 0x18)) {
      QtPrivate::sizedFree((void *)local_298._16_8_,local_298._0_8_ * 0x48);
    }
  }
  if ((this->super_QDomNodePrivate).last == (QDomNodePrivate *)0x0) {
    QTextStream::operator<<(s,"/>");
  }
  else {
    iVar11 = (*((this->super_QDomNodePrivate).first)->_vptr_QDomNodePrivate[0xb])();
    QTextStream::operator<<(s,'>');
    if (indent != -1 && 1 < iVar11 - 3U) {
      Qt::endl(s);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_968);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_948);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomElementPrivate::save(QTextStream& s, int depth, int indent) const
{
    if (!(prev && prev->isText()))
        s << QString(indent < 1 ? 0 : depth * indent, u' ');

    QString qName(name);
    QString nsDecl(u""_s);
    if (!namespaceURI.isNull()) {
        /** ###
         *
         * If we still have QDom, optimize this so that we only declare namespaces that are not
         * yet declared. We loose default namespace mappings, so maybe we should rather store
         * the information that we get from startPrefixMapping()/endPrefixMapping() and use them.
         * Modifications becomes more complex then, however.
         *
         * We cannot do this in a patch release because it would require too invasive changes, and
         * hence possibly behavioral changes.
         */
        if (prefix.isEmpty()) {
            nsDecl = u" xmlns"_s;
        } else {
            qName = prefix + u':' + name;
            nsDecl = u" xmlns:"_s + prefix;
        }
        nsDecl += u"=\""_s + encodeText(namespaceURI) + u'\"';
    }
    s << '<' << qName << nsDecl;


    /* Write out attributes. */
    if (!m_attr->map.isEmpty()) {
        /*
         * To ensure that we always output attributes in a consistent
         * order, sort the attributes before writing them into the
         * stream. (Note that the order may be different than the one
         * that e.g. we've read from a file, or the program order in
         * which these attributes have been populated. We just want to
         * guarantee reproducibile outputs.)
         */
        struct SavedAttribute {
            QString prefix;
            QString name;
            QString encodedValue;
        };

        /* Gather all the attributes to save. */
        QVarLengthArray<SavedAttribute, 8> attributesToSave;
        attributesToSave.reserve(m_attr->map.size());

        QDuplicateTracker<QString> outputtedPrefixes;
        for (const auto &[key, value] : std::as_const(m_attr->map).asKeyValueRange()) {
            Q_UNUSED(key); /* We extract the attribute name from the value. */
            bool mayNeedXmlNS = false;

            SavedAttribute attr;
            attr.name = value->name;
            attr.encodedValue = encodeText(value->value, true, true);
            if (!value->namespaceURI.isNull()) {
                attr.prefix = value->prefix;
                mayNeedXmlNS = true;
            }

            attributesToSave.push_back(std::move(attr));

            /*
             * This is a fix for 138243, as good as it gets.
             *
             * QDomElementPrivate::save() output a namespace
             * declaration if the element is in a namespace, no matter
             * what. This function do as well, meaning that we get two
             * identical namespace declaration if we don't have the if-
             * statement below.
             *
             * This doesn't work when the parent element has the same
             * prefix as us but a different namespace. However, this
             * can only occur by the user modifying the element, and we
             * don't do fixups by that anyway, and hence it's the user
             * responsibility to avoid those situations.
             */

            if (mayNeedXmlNS
                && ((!value->ownerNode || value->ownerNode->prefix != value->prefix)
                    && !outputtedPrefixes.hasSeen(value->prefix)))
            {
                SavedAttribute nsAttr;
                nsAttr.prefix = QStringLiteral("xmlns");
                nsAttr.name = value->prefix;
                nsAttr.encodedValue = encodeText(value->namespaceURI, true, true);
                attributesToSave.push_back(std::move(nsAttr));
            }
        }

        /* Sort the attributes by prefix and name. */
        const auto savedAttributeComparator = [](const SavedAttribute &lhs, const SavedAttribute &rhs)
        {
            const int cmp = QString::compare(lhs.prefix, rhs.prefix);
            return (cmp < 0) || ((cmp == 0) && (lhs.name < rhs.name));
        };

        std::sort(attributesToSave.begin(), attributesToSave.end(), savedAttributeComparator);

        /* Actually stream the sorted attributes. */
        for (const auto &attr : attributesToSave) {
            s << ' ';
            if (!attr.prefix.isEmpty())
                s << attr.prefix << ':';
            s << attr.name << "=\"" << attr.encodedValue << '\"';
        }
    }

    if (last) {
        // has child nodes
        if (first->isText())
            s << '>';
        else {
            s << '>';

            /* -1 disables new lines. */
            if (indent != -1)
                s << Qt::endl;
        }
    } else {
        s << "/>";
    }
}